

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwDestroyWindow(GLFWwindow *handle)

{
  _GLFWwindow *p_Var1;
  _GLFWwindow *in_RDI;
  _GLFWwindow **prev;
  _GLFWwindow *window;
  _GLFWwindow *handle_00;
  _GLFWwindow *local_18;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (in_RDI != (_GLFWwindow *)0x0) {
    memset(&in_RDI->callbacks,0,0x88);
    handle_00 = in_RDI;
    p_Var1 = (_GLFWwindow *)_glfwPlatformGetTls((_GLFWtls *)0x190d76);
    if (handle_00 == p_Var1) {
      glfwMakeContextCurrent((GLFWwindow *)handle_00);
    }
    _glfwPlatformDestroyWindow((_GLFWwindow *)0x190d96);
    for (local_18 = (_GLFWwindow *)&_glfw.windowListHead; local_18->next != in_RDI;
        local_18 = local_18->next) {
    }
    local_18->next = in_RDI->next;
    free(in_RDI);
  }
  return;
}

Assistant:

GLFWAPI void glfwDestroyWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    // Allow closing of NULL (to match the behavior of free)
    if (window == NULL)
        return;

    // Clear all callbacks to avoid exposing a half torn-down window object
    memset(&window->callbacks, 0, sizeof(window->callbacks));

    // The window's context must not be current on another thread when the
    // window is destroyed
    if (window == _glfwPlatformGetTls(&_glfw.contextSlot))
        glfwMakeContextCurrent(NULL);

    _glfwPlatformDestroyWindow(window);

    // Unlink window from global linked list
    {
        _GLFWwindow** prev = &_glfw.windowListHead;

        while (*prev != window)
            prev = &((*prev)->next);

        *prev = window->next;
    }

    free(window);
}